

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLoadUnstructuredPoints.hpp
# Opt level: O1

void TasGrid::loadUnstructuredDataL2
               (vector<double,_std::allocator<double>_> *data_points,
               vector<double,_std::allocator<double>_> *model_values,double tolerance,
               TasmanianSparseGrid *grid)

{
  BaseCanonicalGrid *pBVar1;
  double *data_points_00;
  double *model_values_00;
  char cVar2;
  runtime_error *this;
  int num_data;
  
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Cannot use loadUnstructuredDataL2() with an empty grid.");
  }
  else {
    data_points_00 =
         (data_points->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start;
    model_values_00 =
         (model_values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start;
    num_data = (int)((ulong)((long)(data_points->super__Vector_base<double,_std::allocator<double>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)data_points_00 >> 3) / (ulong)(long)*(int *)(pBVar1 + 0x10));
    if ((ulong)((long)num_data * (long)*(int *)(pBVar1 + 0x14)) <=
        (ulong)((long)(model_values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)model_values_00 >> 3)) {
      cVar2 = (**(code **)(*(long *)pBVar1 + 0x30))();
      if (cVar2 != '\0') {
        loadUnstructuredDataL2tmpl<std::complex<double>>
                  (data_points_00,num_data,model_values_00,tolerance,grid);
        return;
      }
      loadUnstructuredDataL2tmpl<double>(data_points_00,num_data,model_values_00,tolerance,grid);
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"In loadUnstructuredDataL2(), provided more points than data.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void loadUnstructuredDataL2(std::vector<double> const &data_points, std::vector<double> const &model_values,
                                   double tolerance, TasmanianSparseGrid &grid){
    if (grid.empty()) throw std::runtime_error("Cannot use loadUnstructuredDataL2() with an empty grid.");
    int num_data = static_cast<int>(data_points.size() / grid.getNumDimensions());
    if (model_values.size() < Utils::size_mult(num_data, grid.getNumOutputs()))
        throw std::runtime_error("In loadUnstructuredDataL2(), provided more points than data.");
    loadUnstructuredDataL2(data_points.data(), num_data, model_values.data(), tolerance, grid);
}